

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool realloc_array(roaring_array_t *ra,int32_t new_capacity)

{
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  int in_ESI;
  int *in_RDI;
  uint8_t *newtypecodes;
  uint16_t *newkeys;
  container_t **newcontainers;
  void *oldbigalloc;
  void *bigalloc;
  size_t memoryneeded;
  _Bool local_1;
  
  if (in_ESI == 0) {
    roaring_free((void *)0x118ba2);
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    in_RDI[4] = 0;
    in_RDI[5] = 0;
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    in_RDI[1] = 0;
    local_1 = true;
  }
  else {
    __dest = roaring_malloc(0x118bf7);
    if (__dest == (void *)0x0) {
      local_1 = false;
    }
    else {
      __dest_00 = (void *)((long)__dest + (long)in_ESI * 8);
      __dest_01 = (void *)((long)__dest_00 + (long)in_ESI * 2);
      if (0 < *in_RDI) {
        memcpy(__dest,*(void **)(in_RDI + 2),(long)*in_RDI << 3);
        memcpy(__dest_00,*(void **)(in_RDI + 4),(long)*in_RDI << 1);
        memcpy(__dest_01,*(void **)(in_RDI + 6),(long)*in_RDI);
      }
      *(void **)(in_RDI + 2) = __dest;
      *(void **)(in_RDI + 4) = __dest_00;
      *(void **)(in_RDI + 6) = __dest_01;
      in_RDI[1] = in_ESI;
      roaring_free((void *)0x118cf4);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool realloc_array(roaring_array_t *ra, int32_t new_capacity) {
    //
    // Note: not implemented using C's realloc(), because the memory layout is
    // Struct-of-Arrays vs. Array-of-Structs:
    // https://github.com/RoaringBitmap/CRoaring/issues/256

    if (new_capacity == 0) {
        roaring_free(ra->containers);
        ra->containers = NULL;
        ra->keys = NULL;
        ra->typecodes = NULL;
        ra->allocation_size = 0;
        return true;
    }
    const size_t memoryneeded =
        new_capacity *
        (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    void *bigalloc = roaring_malloc(memoryneeded);
    if (!bigalloc) return false;
    void *oldbigalloc = ra->containers;
    container_t **newcontainers = (container_t **)bigalloc;
    uint16_t *newkeys = (uint16_t *)(newcontainers + new_capacity);
    uint8_t *newtypecodes = (uint8_t *)(newkeys + new_capacity);
    assert((char *)(newtypecodes + new_capacity) ==
           (char *)bigalloc + memoryneeded);
    if (ra->size > 0) {
        memcpy(newcontainers, ra->containers, sizeof(container_t *) * ra->size);
        memcpy(newkeys, ra->keys, sizeof(uint16_t) * ra->size);
        memcpy(newtypecodes, ra->typecodes, sizeof(uint8_t) * ra->size);
    }
    ra->containers = newcontainers;
    ra->keys = newkeys;
    ra->typecodes = newtypecodes;
    ra->allocation_size = new_capacity;
    roaring_free(oldbigalloc);
    return true;
}